

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libcalc.cxx
# Opt level: O0

libcalc * __thiscall
libcalc::t2s_abi_cxx11_
          (libcalc *this,vector<libcalc::Token_*,_std::allocator<libcalc::Token_*>_> *tokens)

{
  bool bVar1;
  reference ppTVar2;
  long lVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60 [32];
  Token *local_40;
  Token *t;
  iterator __end1;
  iterator __begin1;
  vector<libcalc::Token_*,_std::allocator<libcalc::Token_*>_> *__range1;
  vector<libcalc::Token_*,_std::allocator<libcalc::Token_*>_> *tokens_local;
  string *out;
  
  std::__cxx11::string::string((string *)this);
  __end1 = std::vector<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>::begin(tokens);
  t = (Token *)std::vector<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>::end(tokens);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<libcalc::Token_**,_std::vector<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>_>
                                     *)&t), bVar1) {
    ppTVar2 = __gnu_cxx::
              __normal_iterator<libcalc::Token_**,_std::vector<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>_>
              ::operator*(&__end1);
    local_40 = *ppTVar2;
    std::operator+(local_60,(char *)local_40);
    std::__cxx11::string::operator+=((string *)this,(string *)local_60);
    std::__cxx11::string::~string((string *)local_60);
    __gnu_cxx::
    __normal_iterator<libcalc::Token_**,_std::vector<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>_>
    ::operator++(&__end1);
  }
  lVar3 = std::__cxx11::string::length();
  std::__cxx11::string::erase((ulong)this,lVar3 - 1);
  return this;
}

Assistant:

std::string t2s(std::vector<Token *> tokens) {
  std::string out;

  for (Token *t : tokens) {
    out += t->value + " ";
  }

  out.erase(out.length() - 1);

  return out;
}